

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerMSL::add_composite_variable_to_interface_block
          (CompilerMSL *this,StorageClass storage,string *ib_var_ref,SPIRType *ib_type,
          SPIRVariable *var,InterfaceBlockMeta *meta)

{
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)0>,_8UL> *pSVar1;
  bool bVar2;
  bool bVar3;
  uint32_t uVar4;
  uint32_t type;
  uint32_t value;
  CompilerError *pCVar5;
  size_t sVar6;
  Bitset *pBVar7;
  SPIREntryPoint *pSVar8;
  TypedID<(spirv_cross::Types)1> *pTVar9;
  size_type sVar10;
  mapped_type *pmVar11;
  SPIRType *pSVar12;
  bool local_3d1;
  SPIRType *local_3b0;
  anon_class_144_10_b368273c local_3a0;
  function<void_()> local_310;
  anon_class_88_5_67c71355 local_2f0;
  function<void_()> local_298;
  uint32_t local_274;
  uint32_t local_270;
  uint32_t local_26c;
  uint32_t local_268;
  uint32_t local_264;
  uint32_t local_260;
  uint32_t local_25c;
  uint32_t local_258;
  uint32_t index;
  uint32_t local_250;
  uint32_t local_24c;
  uint local_248;
  uint32_t local_244;
  uint local_240;
  uint32_t locn_2;
  TypedID<(spirv_cross::Types)1> local_238;
  uint32_t local_234;
  TypedID<(spirv_cross::Types)1> local_230;
  uint32_t mbr_type_id;
  uint32_t local_228;
  uint32_t local_224;
  uint32_t locn_1;
  allocator local_219;
  string local_218 [32];
  undefined1 local_1f8 [64];
  undefined1 local_1b8 [8];
  string mbr_name;
  TypedID<(spirv_cross::Types)1> local_194;
  uint32_t local_190;
  uint32_t local_18c;
  uint32_t local_188;
  uint32_t locn;
  byte local_17d;
  uint32_t type_id;
  uint32_t uStack_178;
  bool padded_output;
  uint32_t target_components;
  uint32_t ib_mbr_idx;
  uint32_t i;
  char local_168 [4];
  uint32_t local_164;
  string local_160 [36];
  uint32_t local_13c;
  TypedID<(spirv_cross::Types)1> local_138;
  uint32_t local_134;
  string local_130 [4];
  uint32_t clip_array_mbr_idx;
  string flatten_from_ib_mbr_name;
  bool local_109;
  string local_108 [7];
  bool flatten_from_ib_var;
  ID local_e4;
  SPIRType *local_e0;
  SPIRType *usable_type;
  byte local_cd;
  uint32_t local_cc;
  bool is_sample;
  uint32_t local_c4;
  bool is_centroid;
  uint32_t local_bc;
  bool is_noperspective;
  uint32_t local_b4;
  uint32_t uStack_b0;
  bool is_flat;
  byte local_ab;
  undefined1 local_aa;
  allocator local_a9;
  BuiltIn builtin;
  bool is_builtin;
  undefined1 local_85;
  allocator local_71;
  string local_70 [36];
  uint32_t local_4c;
  SPIRType *pSStack_48;
  uint32_t elem_cnt;
  SPIRType *var_type;
  SPIRFunction *entry_func;
  InterfaceBlockMeta *meta_local;
  SPIRVariable *var_local;
  SPIRType *ib_type_local;
  string *ib_var_ref_local;
  CompilerMSL *pCStack_10;
  StorageClass storage_local;
  CompilerMSL *this_local;
  
  entry_func = (SPIRFunction *)meta;
  meta_local = (InterfaceBlockMeta *)var;
  var_local = (SPIRVariable *)ib_type;
  ib_type_local = (SPIRType *)ib_var_ref;
  ib_var_ref_local._4_4_ = storage;
  pCStack_10 = this;
  uVar4 = TypedID::operator_cast_to_unsigned_int
                    ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  var_type = (SPIRType *)Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,uVar4);
  if (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0) {
    local_3b0 = Compiler::get_variable_data_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  else {
    local_3b0 = Compiler::get_variable_element_type((Compiler *)this,(SPIRVariable *)meta_local);
  }
  pSStack_48 = local_3b0;
  local_4c = 0;
  bVar2 = Compiler::is_matrix((Compiler *)this,local_3b0);
  if (bVar2) {
    bVar2 = Compiler::is_array((Compiler *)this,pSStack_48);
    if (bVar2) {
      local_85 = 1;
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_70,"MSL cannot emit arrays-of-matrices in input and output variables.",
                 &local_71);
      CompilerError::CompilerError(pCVar5,(string *)local_70);
      local_85 = 0;
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    local_4c = pSStack_48->columns;
  }
  else {
    bVar2 = Compiler::is_array((Compiler *)this,pSStack_48);
    if (bVar2) {
      sVar6 = VectorView<unsigned_int>::size(&(pSStack_48->array).super_VectorView<unsigned_int>);
      if (sVar6 != 1) {
        local_aa = 1;
        pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  ((string *)&builtin,
                   "MSL cannot emit arrays-of-arrays in input and output variables.",&local_a9);
        CompilerError::CompilerError(pCVar5,(string *)&builtin);
        local_aa = 0;
        __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_4c = CompilerGLSL::to_array_size_literal(&this->super_CompilerGLSL,pSStack_48);
    }
  }
  local_ab = Compiler::is_builtin_variable((Compiler *)this,(SPIRVariable *)meta_local);
  local_b4 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  uStack_b0 = Compiler::get_decoration((Compiler *)this,(ID)local_b4,DecorationBuiltIn);
  local_bc = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  is_noperspective = Compiler::has_decoration((Compiler *)this,(ID)local_bc,DecorationFlat);
  local_c4 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  is_centroid = Compiler::has_decoration((Compiler *)this,(ID)local_c4,DecorationNoPerspective);
  local_cc = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  is_sample = Compiler::has_decoration((Compiler *)this,(ID)local_cc,DecorationCentroid);
  usable_type._4_4_ = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
  local_cd = Compiler::has_decoration((Compiler *)this,usable_type._4_4_,DecorationSample);
  local_e0 = pSStack_48;
  if ((pSStack_48->pointer & 1U) != 0) {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_48->parent_type);
    local_e0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
  }
  while( true ) {
    bVar2 = Compiler::is_array((Compiler *)this,local_e0);
    local_3d1 = true;
    if (!bVar2) {
      local_3d1 = Compiler::is_matrix((Compiler *)this,local_e0);
    }
    if (local_3d1 == false) break;
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_e0->parent_type);
    local_e0 = Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar4);
  }
  if ((local_ab & 1) != 0) {
    local_e4.id = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])
              (local_108,this,(ulong)uStack_b0,7);
    Compiler::set_name((Compiler *)this,local_e4,local_108);
    ::std::__cxx11::string::~string((string *)local_108);
  }
  local_109 = false;
  ::std::__cxx11::string::string(local_130);
  pSVar12 = var_type;
  if (((ib_var_ref_local._4_4_ == StorageClassOutput) && ((local_ab & 1) != 0)) && (uStack_b0 == 3))
  {
    sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       ((var_local->dependees).stack_storage.aligned_char + 0x10));
    local_134 = (uint32_t)sVar6;
    pSVar1 = &var_local->dependees;
    uVar4 = Compiler::get_variable_data_type_id((Compiler *)this,(SPIRVariable *)meta_local);
    TypedID<(spirv_cross::Types)1>::TypedID(&local_138,uVar4);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
               ((pSVar1->stack_storage).aligned_char + 0x10),&local_138);
    local_13c = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_decoration
              ((Compiler *)this,(TypeID)local_13c,local_134,DecorationBuiltIn,3);
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x14])(local_160,this,3);
    ::std::__cxx11::string::operator=(local_130,local_160);
    ::std::__cxx11::string::~string(local_160);
    local_164 = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_name((Compiler *)this,(TypeID)local_164,local_134,(string *)local_130);
    local_109 = true;
    if (((this->msl_options).enable_clip_distance_user_varying & 1U) == 0) {
      local_168[0] = '\x01';
      local_168[1] = '\0';
      local_168[2] = '\0';
      local_168[3] = '\0';
      goto LAB_003e5b94;
    }
  }
  else if (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0) {
    i = (uint32_t)
        TypedID::operator_cast_to_TypedID
                  ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    SPIRFunction::add_local_variable((SPIRFunction *)pSVar12,(VariableID)i);
    ib_mbr_idx = TypedID::operator_cast_to_unsigned_int
                           ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    SmallVector<unsigned_int,_8UL>::push_back(&this->vars_needing_early_declaration,&ib_mbr_idx);
  }
  for (target_components = 0; target_components < local_4c;
      target_components = target_components + 1) {
    sVar6 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::size
                      ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                       ((var_local->dependees).stack_storage.aligned_char + 0x10));
    uStack_178 = (uint32_t)sVar6;
    type_id = 0;
    local_17d = 0;
    locn = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_e0->super_IVariant).self);
    local_188 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_188);
    bVar2 = Bitset::get(pBVar7,0x1e);
    if (((bVar2) && (((this->msl_options).pad_fragment_output_components & 1U) != 0)) &&
       ((pSVar8 = Compiler::get_entry_point((Compiler *)this),
        pSVar8->model == ExecutionModelFragment && (ib_var_ref_local._4_4_ == StorageClassOutput))))
    {
      local_190 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_18c = Compiler::get_decoration((Compiler *)this,(ID)local_190,DecorationLocation);
      local_18c = local_18c + target_components;
      type_id = get_target_components_for_fragment_location(this,local_18c);
      if (local_e0->vecsize < type_id) {
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_e0->super_IVariant).self);
        locn = build_extended_vector_type(this,uVar4,type_id,Unknown);
        local_17d = 1;
      }
    }
    pSVar1 = &var_local->dependees;
    uVar4 = Compiler::get_pointee_type_id((Compiler *)this,locn);
    TypedID<(spirv_cross::Types)1>::TypedID(&local_194,uVar4);
    SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL>::push_back
              ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *)
               ((pSVar1->stack_storage).aligned_char + 0x10),&local_194);
    uVar4 = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    CompilerGLSL::to_expression_abi_cxx11_((CompilerGLSL *)local_1f8,(uint32_t)this,SUB41(uVar4,0));
    join<std::__cxx11::string,char_const(&)[2],unsigned_int&>
              ((spirv_cross *)(local_1f8 + 0x20),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1f8,
               (char (*) [2])0x4e3b4c,&target_components);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_218,"m",&local_219);
    ensure_valid_name((CompilerMSL *)local_1b8,(string *)this,(string *)(local_1f8 + 0x20));
    ::std::__cxx11::string::~string(local_218);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_219);
    ::std::__cxx11::string::~string((string *)(local_1f8 + 0x20));
    ::std::__cxx11::string::~string((string *)local_1f8);
    locn_1 = (uint32_t)
             TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
    Compiler::set_member_name((Compiler *)this,(TypeID)locn_1,uStack_178,(string *)local_1b8);
    local_224 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_224);
    bVar2 = Bitset::get(pBVar7,0x1e);
    if (bVar2) {
      mbr_type_id = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_228 = Compiler::get_decoration((Compiler *)this,(ID)mbr_type_id,DecorationLocation);
      local_228 = local_228 + target_components;
      if (ib_var_ref_local._4_4_ == StorageClassInput) {
        uVar4 = TypedID::operator_cast_to_unsigned_int
                          ((TypedID *)((long)&(meta_local->location_meta)._M_h._M_bucket_count + 4))
        ;
        uVar4 = ensure_correct_input_type(this,uVar4,local_228,0);
        TypedID<(spirv_cross::Types)1>::TypedID(&local_230,uVar4);
        *(uint32_t *)((long)&(meta_local->location_meta)._M_h._M_bucket_count + 4) = local_230.id;
        uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(local_e0->super_IVariant).self);
        local_234 = ensure_correct_input_type(this,uVar4,local_228,0);
        TypedID<(spirv_cross::Types)1>::TypedID(&local_238,local_234);
        pTVar9 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::operator[]
                           ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)
                            ((var_local->dependees).stack_storage.aligned_char + 0x10),
                            (ulong)uStack_178);
        pTVar9->id = local_238.id;
      }
      locn_2 = (uint32_t)
               TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)locn_2,uStack_178,DecorationLocation,local_228);
      mark_location_as_used_by_shader(this,local_228,local_e0,ib_var_ref_local._4_4_);
    }
    else {
      bVar2 = false;
      if ((local_ab & 1) != 0) {
        bVar3 = Compiler::is_tessellation_shader((Compiler *)this);
        bVar2 = false;
        if (bVar3) {
          local_240 = uStack_b0;
          sVar10 = ::std::
                   unordered_map<unsigned_int,_spirv_cross::MSLShaderInput,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
                   ::count(&this->inputs_by_builtin,&local_240);
          bVar2 = sVar10 != 0;
        }
      }
      if (bVar2) {
        local_248 = uStack_b0;
        pmVar11 = ::std::
                  unordered_map<unsigned_int,_spirv_cross::MSLShaderInput,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::MSLShaderInput>_>_>
                  ::operator[](&this->inputs_by_builtin,&local_248);
        local_244 = pmVar11->location + target_components;
        local_24c = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)local_24c,uStack_178,DecorationLocation,local_244);
        mark_location_as_used_by_shader(this,local_244,local_e0,ib_var_ref_local._4_4_);
      }
      else if (((local_ab & 1) != 0) && (uStack_b0 == 3)) {
        local_250 = (uint32_t)
                    TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)local_250,uStack_178,DecorationBuiltIn,3);
        index = (uint32_t)
                TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
        Compiler::set_member_decoration
                  ((Compiler *)this,(TypeID)index,uStack_178,DecorationLocation,target_components);
      }
    }
    local_258 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
    pBVar7 = Compiler::get_decoration_bitset((Compiler *)this,(ID)local_258);
    bVar2 = Bitset::get(pBVar7,0x20);
    if (bVar2) {
      local_260 = (uint32_t)(meta_local->location_meta)._M_h._M_bucket_count;
      local_25c = Compiler::get_decoration((Compiler *)this,(ID)local_260,DecorationIndex);
      local_264 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_264,uStack_178,DecorationIndex,local_25c);
    }
    if ((is_noperspective & 1U) != 0) {
      local_268 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_268,uStack_178,DecorationFlat,0);
    }
    if ((is_centroid & 1U) != 0) {
      local_26c = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_26c,uStack_178,DecorationNoPerspective,0);
    }
    if ((is_sample & 1U) != 0) {
      local_270 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_270,uStack_178,DecorationCentroid,0);
    }
    if ((local_cd & 1) != 0) {
      local_274 = (uint32_t)
                  TypedID::operator_cast_to_TypedID((TypedID *)&(var_local->super_IVariant).self);
      Compiler::set_member_decoration
                ((Compiler *)this,(TypeID)local_274,uStack_178,DecorationSample,0);
    }
    type = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var_local->super_IVariant).self);
    uVar4 = uStack_178;
    value = TypedID::operator_cast_to_unsigned_int
                      ((TypedID *)&(meta_local->location_meta)._M_h._M_bucket_count);
    Compiler::set_extended_member_decoration
              ((Compiler *)this,type,uVar4,SPIRVCrossDecorationInterfaceOrigID,value);
    if (((entry_func->arguments).stack_storage.aligned_char[8] & 1U) == 0) {
      if (ib_var_ref_local._4_4_ == StorageClassInput) {
        pSVar12 = var_type + 2;
        local_2f0.var = (SPIRVariable *)meta_local;
        local_2f0.i = target_components;
        local_2f0.this = this;
        ::std::__cxx11::string::string((string *)&local_2f0.ib_var_ref,(string *)ib_type_local);
        ::std::__cxx11::string::string((string *)&local_2f0.mbr_name,(string *)local_1b8);
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__0,void>
                  ((function<void()> *)&local_298,&local_2f0);
        SmallVector<std::function<void_()>,_0UL>::push_back
                  ((SmallVector<std::function<void_()>,_0UL> *)&pSVar12->array,&local_298);
        ::std::function<void_()>::~function(&local_298);
        add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_0::~__0((__0 *)&local_2f0);
      }
      else if (ib_var_ref_local._4_4_ == StorageClassOutput) {
        pSVar12 = var_type + 2;
        local_3a0.var = (SPIRVariable *)meta_local;
        local_3a0.padded_output = (bool)(local_17d & 1);
        local_3a0.type_id = locn;
        local_3a0.this = this;
        ::std::__cxx11::string::string((string *)&local_3a0.ib_var_ref,(string *)ib_type_local);
        ::std::__cxx11::string::string((string *)&local_3a0.mbr_name,(string *)local_1b8);
        local_3a0.usable_type = local_e0;
        local_3a0.i = target_components;
        local_3a0.flatten_from_ib_var = local_109;
        ::std::__cxx11::string::string((string *)&local_3a0.flatten_from_ib_mbr_name,local_130);
        ::std::function<void()>::
        function<spirv_cross::CompilerMSL::add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)::__1,void>
                  ((function<void()> *)&local_310,&local_3a0);
        SmallVector<std::function<void_()>,_0UL>::push_back
                  ((SmallVector<std::function<void_()>,_0UL> *)pSVar12,&local_310);
        ::std::function<void_()>::~function(&local_310);
        add_composite_variable_to_interface_block(spv::StorageClass,std::__cxx11::string_const&,spirv_cross::SPIRType&,spirv_cross::SPIRVariable&,spirv_cross::CompilerMSL::InterfaceBlockMeta&)
        ::$_1::~__1((__1 *)&local_3a0);
      }
    }
    ::std::__cxx11::string::~string((string *)local_1b8);
  }
  local_168[0] = '\0';
  local_168[1] = '\0';
  local_168[2] = '\0';
  local_168[3] = '\0';
LAB_003e5b94:
  ::std::__cxx11::string::~string(local_130);
  return;
}

Assistant:

void CompilerMSL::add_composite_variable_to_interface_block(StorageClass storage, const string &ib_var_ref,
                                                            SPIRType &ib_type, SPIRVariable &var,
                                                            InterfaceBlockMeta &meta)
{
	auto &entry_func = get<SPIRFunction>(ir.default_entry_point);
	auto &var_type = meta.strip_array ? get_variable_element_type(var) : get_variable_data_type(var);
	uint32_t elem_cnt = 0;

	if (is_matrix(var_type))
	{
		if (is_array(var_type))
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-matrices in input and output variables.");

		elem_cnt = var_type.columns;
	}
	else if (is_array(var_type))
	{
		if (var_type.array.size() != 1)
			SPIRV_CROSS_THROW("MSL cannot emit arrays-of-arrays in input and output variables.");

		elem_cnt = to_array_size_literal(var_type);
	}

	bool is_builtin = is_builtin_variable(var);
	BuiltIn builtin = BuiltIn(get_decoration(var.self, DecorationBuiltIn));
	bool is_flat = has_decoration(var.self, DecorationFlat);
	bool is_noperspective = has_decoration(var.self, DecorationNoPerspective);
	bool is_centroid = has_decoration(var.self, DecorationCentroid);
	bool is_sample = has_decoration(var.self, DecorationSample);

	auto *usable_type = &var_type;
	if (usable_type->pointer)
		usable_type = &get<SPIRType>(usable_type->parent_type);
	while (is_array(*usable_type) || is_matrix(*usable_type))
		usable_type = &get<SPIRType>(usable_type->parent_type);

	// If a builtin, force it to have the proper name.
	if (is_builtin)
		set_name(var.self, builtin_to_glsl(builtin, StorageClassFunction));

	bool flatten_from_ib_var = false;
	string flatten_from_ib_mbr_name;

	if (storage == StorageClassOutput && is_builtin && builtin == BuiltInClipDistance)
	{
		// Also declare [[clip_distance]] attribute here.
		uint32_t clip_array_mbr_idx = uint32_t(ib_type.member_types.size());
		ib_type.member_types.push_back(get_variable_data_type_id(var));
		set_member_decoration(ib_type.self, clip_array_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);

		flatten_from_ib_mbr_name = builtin_to_glsl(BuiltInClipDistance, StorageClassOutput);
		set_member_name(ib_type.self, clip_array_mbr_idx, flatten_from_ib_mbr_name);

		// When we flatten, we flatten directly from the "out" struct,
		// not from a function variable.
		flatten_from_ib_var = true;

		if (!msl_options.enable_clip_distance_user_varying)
			return;
	}
	else if (!meta.strip_array)
	{
		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		entry_func.add_local_variable(var.self);
		// We need to declare the variable early and at entry-point scope.
		vars_needing_early_declaration.push_back(var.self);
	}

	for (uint32_t i = 0; i < elem_cnt; i++)
	{
		// Add a reference to the variable type to the interface struct.
		uint32_t ib_mbr_idx = uint32_t(ib_type.member_types.size());

		uint32_t target_components = 0;
		bool padded_output = false;
		uint32_t type_id = usable_type->self;

		// Check if we need to pad fragment output to match a certain number of components.
		if (get_decoration_bitset(var.self).get(DecorationLocation) && msl_options.pad_fragment_output_components &&
		    get_entry_point().model == ExecutionModelFragment && storage == StorageClassOutput)
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			target_components = get_target_components_for_fragment_location(locn);
			if (usable_type->vecsize < target_components)
			{
				// Make a new type here.
				type_id = build_extended_vector_type(usable_type->self, target_components);
				padded_output = true;
			}
		}

		ib_type.member_types.push_back(get_pointee_type_id(type_id));

		// Give the member a name
		string mbr_name = ensure_valid_name(join(to_expression(var.self), "_", i), "m");
		set_member_name(ib_type.self, ib_mbr_idx, mbr_name);

		// There is no qualified alias since we need to flatten the internal array on return.
		if (get_decoration_bitset(var.self).get(DecorationLocation))
		{
			uint32_t locn = get_decoration(var.self, DecorationLocation) + i;
			if (storage == StorageClassInput)
			{
				var.basetype = ensure_correct_input_type(var.basetype, locn);
				uint32_t mbr_type_id = ensure_correct_input_type(usable_type->self, locn);
				ib_type.member_types[ib_mbr_idx] = mbr_type_id;
			}
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && is_tessellation_shader() && inputs_by_builtin.count(builtin))
		{
			uint32_t locn = inputs_by_builtin[builtin].location + i;
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, locn);
			mark_location_as_used_by_shader(locn, *usable_type, storage);
		}
		else if (is_builtin && builtin == BuiltInClipDistance)
		{
			// Declare the ClipDistance as [[user(clipN)]].
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationBuiltIn, BuiltInClipDistance);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationLocation, i);
		}

		if (get_decoration_bitset(var.self).get(DecorationIndex))
		{
			uint32_t index = get_decoration(var.self, DecorationIndex);
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationIndex, index);
		}

		// Copy interpolation decorations if needed
		if (is_flat)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationFlat);
		if (is_noperspective)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationNoPerspective);
		if (is_centroid)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationCentroid);
		if (is_sample)
			set_member_decoration(ib_type.self, ib_mbr_idx, DecorationSample);

		set_extended_member_decoration(ib_type.self, ib_mbr_idx, SPIRVCrossDecorationInterfaceOrigID, var.self);

		// Only flatten/unflatten IO composites for non-tessellation cases where arrays are not stripped.
		if (!meta.strip_array)
		{
			switch (storage)
			{
			case StorageClassInput:
				entry_func.fixup_hooks_in.push_back(
				    [=, &var]() { statement(to_name(var.self), "[", i, "] = ", ib_var_ref, ".", mbr_name, ";"); });
				break;

			case StorageClassOutput:
				entry_func.fixup_hooks_out.push_back([=, &var]() {
					if (padded_output)
					{
						auto &padded_type = this->get<SPIRType>(type_id);
						statement(
						    ib_var_ref, ".", mbr_name, " = ",
						    remap_swizzle(padded_type, usable_type->vecsize, join(to_name(var.self), "[", i, "]")),
						    ";");
					}
					else if (flatten_from_ib_var)
						statement(ib_var_ref, ".", mbr_name, " = ", ib_var_ref, ".", flatten_from_ib_mbr_name, "[", i,
						          "];");
					else
						statement(ib_var_ref, ".", mbr_name, " = ", to_name(var.self), "[", i, "];");
				});
				break;

			default:
				break;
			}
		}
	}
}